

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpserver.cpp
# Opt level: O0

void __thiscall uv::AcceptClient::Close(AcceptClient *this)

{
  CStringStream *pCVar1;
  ILog4zManager *pIVar2;
  long *in_FS_OFFSET;
  undefined1 local_28 [8];
  CStringStream ss;
  AcceptClient *this_local;
  
  if ((this->isclosed_ & 1U) == 0) {
    (this->client_handle_->tcphandle).data = this;
    ss.m_pCur = (char *)this;
    uv_close(this->client_handle_,AfterClientClose);
    zsummer::log4z::CStringStream::CStringStream
              ((CStringStream *)local_28,(char *)(*in_FS_OFFSET + -0x800),0x800);
    pCVar1 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_28,"client(");
    pCVar1 = zsummer::log4z::CStringStream::operator<<(pCVar1,this);
    zsummer::log4z::CStringStream::operator<<(pCVar1,")close");
    pCVar1 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_28," ( ");
    pCVar1 = zsummer::log4z::CStringStream::operator<<(pCVar1," ");
    pCVar1 = zsummer::log4z::CStringStream::operator<<(pCVar1," ) : ");
    zsummer::log4z::CStringStream::operator<<(pCVar1,0x218);
    pIVar2 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar2->_vptr_ILog4zManager[8])(pIVar2,0,1,*in_FS_OFFSET + -0x800);
  }
  return;
}

Assistant:

void AcceptClient::Close()
{
    if (isclosed_) {
        return;
    }
    client_handle_->tcphandle.data = this;
    //send close command
    uv_close((uv_handle_t*)&client_handle_->tcphandle, AfterClientClose);
    LOGI("client(" << this << ")close");
}